

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_regex.cc
# Opt level: O2

string * escape_char(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  char *__s;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  allocator<char> local_21;
  
  sVar3 = s->_M_string_length;
  __s = (char *)operator_new__(sVar3 * 2 + 1);
  pcVar4 = (s->_M_dataplus)._M_p;
  uVar6 = 0;
  iVar5 = 0;
  do {
    lVar8 = (long)iVar5;
    iVar9 = (int)sVar3;
    if (iVar9 <= (int)uVar6) {
      __s[lVar8] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_21);
      operator_delete__(__s);
      return __return_storage_ptr__;
    }
    cVar2 = pcVar4[(int)uVar6];
    if (cVar2 == '\"') {
      (__s + lVar8)[0] = '\\';
      (__s + lVar8)[1] = '\"';
      iVar5 = iVar5 + 2;
      uVar7 = (ulong)uVar6;
      goto LAB_00120a63;
    }
    if (cVar2 == '\\') {
      uVar7 = (long)(int)uVar6 + 1;
      if (iVar9 <= (int)uVar7) goto LAB_00120a61;
      lVar1 = lVar8 + 1;
      __s[lVar8] = '\\';
      cVar2 = pcVar4[uVar7];
      if ((cVar2 == '\"') || (cVar2 == '\\')) {
        iVar5 = iVar5 + 2;
        __s[lVar1] = cVar2;
      }
      else {
        if (cVar2 != '/') {
          iVar5 = iVar5 + 2;
          __s[lVar1] = '\\';
          goto LAB_00120a61;
        }
        __s[lVar8] = '/';
        iVar5 = (int)lVar1;
      }
    }
    else {
      iVar5 = iVar5 + 1;
      __s[lVar8] = cVar2;
LAB_00120a61:
      uVar7 = (ulong)uVar6;
    }
LAB_00120a63:
    uVar6 = (int)uVar7 + 1;
  } while( true );
}

Assistant:

string escape_char(const string& s)
	{
	char* buf = new char[s.length() * 2 + 1];
	int j = 0;
	for ( int i = 0; i < (int)s.length(); ++i )
		{
		if ( s[i] == '\\' )
			{
			if ( i + 1 < (int)s.length() )
				{
				buf[j++] = '\\';
				if ( s[i + 1] == '/' )
					buf[j - 1] = s[++i];
				else if ( s[i + 1] == '/' || s[i + 1] == '\\' || s[i + 1] == '"' )
					buf[j++] = s[++i];
				else
					buf[j++] = '\\';
				}
			}
		else if ( s[i] == '"' )
			{
			buf[j++] = '\\';
			buf[j++] = '"';
			}
		else
			{
			buf[j++] = s[i];
			}
		}

	buf[j++] = '\0';

	string rval = buf;
	delete[] buf;
	return rval;
	}